

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA2.c
# Opt level: O3

Hacl_Streaming_Types_error_code
update_224_256(Hacl_Streaming_MD_state_32 *state,uint8_t *chunk,uint32_t chunk_len)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint64_t uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *b0;
  uint8_t *__src;
  uint32_t *puVar10;
  bool bVar11;
  bool bVar12;
  uint8_t *b0_1;
  
  uVar3 = state->total_len;
  uVar2 = (ulong)chunk_len;
  if (0x1fffffffffffffff - uVar3 < uVar2) {
    return '\x03';
  }
  uVar4 = (uint)uVar3 & 0x3f;
  uVar5 = (ulong)uVar4;
  bVar11 = (uVar3 & 0x3f) == 0;
  bVar12 = uVar3 != 0;
  if (bVar12 && bVar11) {
    uVar4 = 0x40;
  }
  uVar1 = 0x40 - uVar4;
  uVar6 = chunk_len - uVar1;
  if (chunk_len < uVar1 || uVar6 == 0) {
    puVar10 = state->block_state;
    puVar9 = state->buf;
    if (bVar12 && bVar11) {
      uVar5 = 0x40;
    }
    memcpy(puVar9 + uVar5,chunk,uVar2);
    uVar7 = uVar3 + uVar2;
  }
  else {
    if (uVar4 == 0) {
      puVar10 = state->block_state;
      puVar9 = state->buf;
      if ((uVar5 == 0) == (bVar12 && bVar11)) {
        sha256_update(puVar9,puVar10);
      }
      uVar4 = 0x40;
      if ((chunk_len & 0x3f) != 0) {
        uVar4 = chunk_len & 0x3f;
      }
      uVar4 = chunk_len - uVar4;
      puVar8 = chunk + (uVar4 & 0xffffffc0);
      if (0x3f < uVar4) {
        uVar5 = (ulong)(uVar4 >> 6);
        do {
          sha256_update(chunk,puVar10);
          chunk = chunk + 0x40;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      memcpy(puVar9,puVar8,(ulong)(chunk_len - (uVar4 & 0xffffffc0)));
      uVar7 = uVar3 + uVar2;
      state->block_state = puVar10;
      state->buf = puVar9;
      goto LAB_0011f232;
    }
    uVar2 = (ulong)uVar1;
    puVar8 = chunk + uVar2;
    puVar10 = state->block_state;
    puVar9 = state->buf;
    if (bVar12 && bVar11) {
      uVar5 = 0x40;
    }
    memcpy(puVar9 + uVar5,chunk,uVar2);
    state->block_state = puVar10;
    state->buf = puVar9;
    uVar7 = uVar3 + uVar2;
    state->total_len = uVar7;
    if (uVar7 != 0) {
      sha256_update(puVar9,puVar10);
    }
    uVar4 = 0x40;
    if ((uVar6 & 0x3f) != 0) {
      uVar4 = uVar6 & 0x3f;
    }
    uVar4 = uVar6 - uVar4;
    __src = puVar8 + (uVar4 & 0xffffffc0);
    if (0x3f < uVar4) {
      uVar3 = (ulong)(uVar4 >> 6);
      do {
        sha256_update(puVar8,puVar10);
        puVar8 = puVar8 + 0x40;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    memcpy(puVar9,__src,(ulong)(uVar6 - (uVar4 & 0xffffffc0)));
    uVar7 = uVar7 + uVar6;
  }
  state->block_state = puVar10;
  state->buf = puVar9;
LAB_0011f232:
  state->total_len = uVar7;
  return '\0';
}

Assistant:

static inline Hacl_Streaming_Types_error_code
update_224_256(Hacl_Streaming_MD_state_32 *state, uint8_t *chunk, uint32_t chunk_len)
{
  Hacl_Streaming_MD_state_32 s = *state;
  uint64_t total_len = s.total_len;
  if ((uint64_t)chunk_len > 2305843009213693951ULL - total_len)
  {
    return Hacl_Streaming_Types_MaximumLengthExceeded;
  }
  uint32_t sz;
  if (total_len % (uint64_t)64U == 0ULL && total_len > 0ULL)
  {
    sz = 64U;
  }
  else
  {
    sz = (uint32_t)(total_len % (uint64_t)64U);
  }
  if (chunk_len <= 64U - sz)
  {
    Hacl_Streaming_MD_state_32 s1 = *state;
    uint32_t *block_state1 = s1.block_state;
    uint8_t *buf = s1.buf;
    uint64_t total_len1 = s1.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)64U == 0ULL && total_len1 > 0ULL)
    {
      sz1 = 64U;
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)64U);
    }
    uint8_t *buf2 = buf + sz1;
    memcpy(buf2, chunk, chunk_len * sizeof (uint8_t));
    uint64_t total_len2 = total_len1 + (uint64_t)chunk_len;
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len2
        }
      );
  }
  else if (sz == 0U)
  {
    Hacl_Streaming_MD_state_32 s1 = *state;
    uint32_t *block_state1 = s1.block_state;
    uint8_t *buf = s1.buf;
    uint64_t total_len1 = s1.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)64U == 0ULL && total_len1 > 0ULL)
    {
      sz1 = 64U;
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)64U);
    }
    if (!(sz1 == 0U))
    {
      Hacl_Hash_SHA2_sha256_update_nblocks(64U, buf, block_state1);
    }
    uint32_t ite;
    if ((uint64_t)chunk_len % (uint64_t)64U == 0ULL && (uint64_t)chunk_len > 0ULL)
    {
      ite = 64U;
    }
    else
    {
      ite = (uint32_t)((uint64_t)chunk_len % (uint64_t)64U);
    }
    uint32_t n_blocks = (chunk_len - ite) / 64U;
    uint32_t data1_len = n_blocks * 64U;
    uint32_t data2_len = chunk_len - data1_len;
    uint8_t *data1 = chunk;
    uint8_t *data2 = chunk + data1_len;
    Hacl_Hash_SHA2_sha256_update_nblocks(data1_len / 64U * 64U, data1, block_state1);
    uint8_t *dst = buf;
    memcpy(dst, data2, data2_len * sizeof (uint8_t));
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len1 + (uint64_t)chunk_len
        }
      );
  }
  else
  {
    uint32_t diff = 64U - sz;
    uint8_t *chunk1 = chunk;
    uint8_t *chunk2 = chunk + diff;
    Hacl_Streaming_MD_state_32 s1 = *state;
    uint32_t *block_state10 = s1.block_state;
    uint8_t *buf0 = s1.buf;
    uint64_t total_len10 = s1.total_len;
    uint32_t sz10;
    if (total_len10 % (uint64_t)64U == 0ULL && total_len10 > 0ULL)
    {
      sz10 = 64U;
    }
    else
    {
      sz10 = (uint32_t)(total_len10 % (uint64_t)64U);
    }
    uint8_t *buf2 = buf0 + sz10;
    memcpy(buf2, chunk1, diff * sizeof (uint8_t));
    uint64_t total_len2 = total_len10 + (uint64_t)diff;
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state10,
          .buf = buf0,
          .total_len = total_len2
        }
      );
    Hacl_Streaming_MD_state_32 s10 = *state;
    uint32_t *block_state1 = s10.block_state;
    uint8_t *buf = s10.buf;
    uint64_t total_len1 = s10.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)64U == 0ULL && total_len1 > 0ULL)
    {
      sz1 = 64U;
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)64U);
    }
    if (!(sz1 == 0U))
    {
      Hacl_Hash_SHA2_sha256_update_nblocks(64U, buf, block_state1);
    }
    uint32_t ite;
    if
    ((uint64_t)(chunk_len - diff) % (uint64_t)64U == 0ULL && (uint64_t)(chunk_len - diff) > 0ULL)
    {
      ite = 64U;
    }
    else
    {
      ite = (uint32_t)((uint64_t)(chunk_len - diff) % (uint64_t)64U);
    }
    uint32_t n_blocks = (chunk_len - diff - ite) / 64U;
    uint32_t data1_len = n_blocks * 64U;
    uint32_t data2_len = chunk_len - diff - data1_len;
    uint8_t *data1 = chunk2;
    uint8_t *data2 = chunk2 + data1_len;
    Hacl_Hash_SHA2_sha256_update_nblocks(data1_len / 64U * 64U, data1, block_state1);
    uint8_t *dst = buf;
    memcpy(dst, data2, data2_len * sizeof (uint8_t));
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len1 + (uint64_t)(chunk_len - diff)
        }
      );
  }
  return Hacl_Streaming_Types_Success;
}